

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlIsMixedElement(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_50;
  undefined8 local_48;
  xmlChar *name;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlIsMixedElement",&name,&local_48);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (name == &_Py_NoneStruct) {
      local_50 = (PyObject *)0x0;
    }
    else {
      local_50 = *(PyObject **)(name + 0x10);
    }
    pyobj_doc = local_50;
    doc._4_4_ = xmlIsMixedElement(local_50,local_48);
    self_local = libxml_intWrap(doc._4_4_);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlIsMixedElement(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlChar * name;

    if (!PyArg_ParseTuple(args, (char *)"Oz:xmlIsMixedElement", &pyobj_doc, &name))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlIsMixedElement(doc, name);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}